

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O2

void select_scan_parameters(j_compress_ptr cinfo)

{
  uint uVar1;
  jpeg_scan_info *pjVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  int iVar5;
  jpeg_component_info **ppjVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  pjVar2 = cinfo->scan_info;
  if (pjVar2 == (jpeg_scan_info *)0x0) {
    uVar1 = cinfo->num_components;
    if (4 < (int)uVar1) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x1b;
      (pjVar3->msg_parm).i[0] = uVar1;
      (cinfo->err->msg_parm).i[1] = 4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      uVar1 = cinfo->num_components;
    }
    uVar7 = (ulong)uVar1;
    cinfo->comps_in_scan = uVar1;
    ppjVar6 = cinfo->cur_comp_info;
    lVar8 = 0;
    if ((int)uVar1 < 1) {
      uVar7 = 0;
    }
    for (; uVar7 * 0x60 - lVar8 != 0; lVar8 = lVar8 + 0x60) {
      *ppjVar6 = (jpeg_component_info *)((long)&cinfo->comp_info->component_id + lVar8);
      ppjVar6 = ppjVar6 + 1;
    }
  }
  else {
    iVar5 = *(int *)((long)&cinfo->master[1].pass_startup + 4);
    uVar1 = pjVar2[iVar5].comps_in_scan;
    cinfo->comps_in_scan = uVar1;
    uVar9 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      cinfo->cur_comp_info[uVar9] = cinfo->comp_info + pjVar2[iVar5].component_index[uVar9];
    }
    if (cinfo->progressive_mode != 0) {
      iVar4 = pjVar2[iVar5].Se;
      cinfo->Ss = pjVar2[iVar5].Ss;
      cinfo->Se = iVar4;
      cinfo->Ah = pjVar2[iVar5].Ah;
      iVar5 = pjVar2[iVar5].Al;
      goto LAB_001ce91e;
    }
  }
  cinfo->Ss = 0;
  cinfo->Se = cinfo->block_size * cinfo->block_size + -1;
  cinfo->Ah = 0;
  iVar5 = 0;
LAB_001ce91e:
  cinfo->Al = iVar5;
  return;
}

Assistant:

LOCAL(void)
select_scan_parameters (j_compress_ptr cinfo)
/* Set up the scan parameters for the current scan */
{
  int ci;

#ifdef C_MULTISCAN_FILES_SUPPORTED
  if (cinfo->scan_info != NULL) {
    /* Prepare for current scan --- the script is already validated */
    my_master_ptr master = (my_master_ptr) cinfo->master;
    const jpeg_scan_info * scanptr = cinfo->scan_info + master->scan_number;

    cinfo->comps_in_scan = scanptr->comps_in_scan;
    for (ci = 0; ci < scanptr->comps_in_scan; ci++) {
      cinfo->cur_comp_info[ci] =
	&cinfo->comp_info[scanptr->component_index[ci]];
    }
    if (cinfo->progressive_mode) {
      cinfo->Ss = scanptr->Ss;
      cinfo->Se = scanptr->Se;
      cinfo->Ah = scanptr->Ah;
      cinfo->Al = scanptr->Al;
      return;
    }
  }
  else
#endif
  {
    /* Prepare for single sequential-JPEG scan containing all components */
    if (cinfo->num_components > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	       MAX_COMPS_IN_SCAN);
    cinfo->comps_in_scan = cinfo->num_components;
    for (ci = 0; ci < cinfo->num_components; ci++) {
      cinfo->cur_comp_info[ci] = &cinfo->comp_info[ci];
    }
  }
  cinfo->Ss = 0;
  cinfo->Se = cinfo->block_size * cinfo->block_size - 1;
  cinfo->Ah = 0;
  cinfo->Al = 0;
}